

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::RoundScalarWithFormatT<float,float>(char *format,ImGuiDataType data_type,float v)

{
  byte bVar1;
  char cVar2;
  double dVar3;
  byte *pbVar4;
  char cVar5;
  byte *pbVar6;
  long lVar7;
  uint uVar8;
  char *__nptr;
  char *pcVar9;
  float fVar10;
  char fmt_sanitized [32];
  char v_str [64];
  byte local_78 [32];
  char local_58 [72];
  
  bVar1 = *format;
  while( true ) {
    if (bVar1 == 0) {
      return v;
    }
    if ((bVar1 == 0x25) && (((byte *)format)[1] != 0x25)) break;
    format = (char *)((byte *)format + (ulong)(bVar1 == 0x25) + 1);
    bVar1 = *format;
  }
  pbVar4 = (byte *)ImParseFormatFindEnd(format);
  pbVar6 = local_78;
  if (format < pbVar4) {
    do {
      uVar8 = (byte)*format - 0x24;
      if ((0x3b < uVar8) || ((0x800000000000009U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) {
        *pbVar6 = *format;
        pbVar6 = pbVar6 + 1;
      }
      format = (char *)((byte *)format + 1);
    } while ((byte *)format != pbVar4);
  }
  *pbVar6 = 0;
  ImFormatString(local_58,0x40,(char *)local_78,SUB84((double)v,0));
  pcVar9 = local_58;
  do {
    __nptr = pcVar9;
    cVar2 = *__nptr;
    pcVar9 = __nptr + 1;
  } while (cVar2 == ' ');
  if ((data_type & 0xfffffffeU) == 8) {
    dVar3 = atof(__nptr);
    fVar10 = (float)dVar3;
  }
  else {
    lVar7 = (ulong)(__nptr[cVar2 == '-'] == '+') + (ulong)(cVar2 == '-');
    cVar5 = __nptr[lVar7];
    fVar10 = 0.0;
    if ((byte)(cVar5 - 0x30U) < 10) {
      pcVar9 = __nptr + 1 + lVar7;
      do {
        fVar10 = fVar10 * 10.0 + (float)(int)(char)(cVar5 + -0x30);
        cVar5 = *pcVar9;
        pcVar9 = pcVar9 + 1;
      } while ((byte)(cVar5 - 0x30U) < 10);
    }
    if (cVar2 == '-') {
      fVar10 = -fVar10;
    }
  }
  return fVar10;
}

Assistant:

const char* ImParseFormatFindStart(const char* fmt)
{
    while (char c = fmt[0])
    {
        if (c == '%' && fmt[1] != '%')
            return fmt;
        else if (c == '%')
            fmt++;
        fmt++;
    }
    return fmt;
}